

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::TableBinding::Bind
          (BindResult *__return_storage_ptr__,TableBinding *this,ColumnRefExpression *colref,
          idx_t depth)

{
  LogicalIndex idx;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  string *__k;
  iterator iVar4;
  undefined4 extraout_var;
  reference pvVar5;
  ulong uVar6;
  _Hash_node_base *p_Var7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  LogicalType col_type;
  optional_ptr<duckdb::StandardEntry,_true> entry;
  ColumnBinding binding;
  Expression *local_110;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_108;
  LogicalType local_100;
  optional_ptr<duckdb::StandardEntry,_true> local_e8;
  idx_t local_e0;
  ColumnBinding local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [128];
  
  local_e0 = depth;
  __k = ColumnRefExpression::GetColumnName_abi_cxx11_(colref);
  iVar4 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->super_Binding).name_map._M_h,__k);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    (*(this->super_Binding)._vptr_Binding[2])((ErrorData *)local_a8,this,__k);
    BindResult::BindResult(__return_storage_ptr__,(ErrorData *)local_a8);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_a8 + 0x48));
    if ((undefined1 *)local_a8._40_8_ != local_a8 + 0x38) {
      operator_delete((void *)local_a8._40_8_);
    }
    if ((undefined1 *)local_a8._8_8_ != local_a8 + 0x18) {
      operator_delete((void *)local_a8._8_8_);
    }
  }
  else {
    idx.index = *(idx_t *)((long)iVar4.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                 ._M_cur + 0x28);
    iVar3 = (*(this->super_Binding)._vptr_Binding[4])(this);
    local_e8.ptr = (StandardEntry *)CONCAT44(extraout_var,iVar3);
    if (((TableCatalogEntry *)local_e8.ptr != (TableCatalogEntry *)0x0) &&
       (bVar2 = IsVirtualColumn(idx.index), !bVar2)) {
      optional_ptr<duckdb::StandardEntry,_true>::CheckValid(&local_e8);
      TableCatalogEntry::GetColumn((TableCatalogEntry *)local_e8.ptr,idx);
    }
    LogicalType::LogicalType(&local_100);
    uVar1 = (this->virtual_columns)._M_h._M_bucket_count;
    uVar6 = idx.index % uVar1;
    p_Var8 = (this->virtual_columns)._M_h._M_buckets[uVar6];
    p_Var9 = (__node_base_ptr)0x0;
    if ((p_Var8 != (__node_base_ptr)0x0) &&
       (p_Var7 = p_Var8->_M_nxt, p_Var9 = p_Var8,
       (_Hash_node_base *)idx.index != p_Var8->_M_nxt[1]._M_nxt)) {
      while (p_Var8 = p_Var7, p_Var7 = p_Var8->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
        p_Var9 = (__node_base_ptr)0x0;
        if (((ulong)p_Var7[1]._M_nxt % uVar1 != uVar6) ||
           (p_Var9 = p_Var8, (_Hash_node_base *)idx.index == p_Var7[1]._M_nxt)) goto LAB_00e389a5;
      }
      p_Var9 = (__node_base_ptr)0x0;
    }
LAB_00e389a5:
    if (p_Var9 == (__node_base_ptr)0x0) {
      p_Var7 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var7 = p_Var9->_M_nxt;
    }
    if (p_Var7 == (_Hash_node_base *)0x0) {
      pvVar5 = vector<duckdb::LogicalType,_true>::operator[](&(this->super_Binding).types,idx.index)
      ;
      if (&local_100 != pvVar5) {
        local_100.id_ = pvVar5->id_;
        local_100.physical_type_ = pvVar5->physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&local_100.type_info_,&pvVar5->type_info_);
      }
      if ((colref->super_ParsedExpression).super_BaseExpression.alias._M_string_length == 0) {
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::operator[](&(this->super_Binding).names,idx.index);
        ::std::__cxx11::string::_M_assign
                  ((string *)&(colref->super_ParsedExpression).super_BaseExpression.alias);
      }
    }
    else if (&local_100 != (LogicalType *)(p_Var7 + 6)) {
      local_100.id_ = *(LogicalTypeId *)&p_Var7[6]._M_nxt;
      local_100.physical_type_ = *(PhysicalType *)((long)&p_Var7[6]._M_nxt + 1);
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&local_100.type_info_,(shared_ptr<duckdb::ExtraTypeInfo,_true> *)(p_Var7 + 7));
    }
    local_d8 = GetColumnBinding(this,idx.index);
    (*(colref->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
              (&local_c8,colref);
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding&,unsigned_long&>
              ((duckdb *)&local_110,&local_c8,&local_100,&local_d8,&local_e0);
    local_108._M_head_impl = local_110;
    local_110 = (Expression *)0x0;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_108);
    if (local_108._M_head_impl != (Expression *)0x0) {
      (*((local_108._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_108._M_head_impl = (Expression *)0x0;
    if (local_110 != (Expression *)0x0) {
      (**(code **)(*(long *)local_110 + 8))();
    }
    local_110 = (Expression *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    LogicalType::~LogicalType(&local_100);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult TableBinding::Bind(ColumnRefExpression &colref, idx_t depth) {
	auto &column_name = colref.GetColumnName();
	column_t column_index;
	bool success = false;
	success = TryGetBindingIndex(column_name, column_index);
	if (!success) {
		return BindResult(ColumnNotFoundError(column_name));
	}
	auto entry = GetStandardEntry();
	if (entry && !IsVirtualColumn(column_index)) {
		D_ASSERT(entry->type == CatalogType::TABLE_ENTRY);
		// Either there is no table, or the columns category has to be standard
		auto &table_entry = entry->Cast<TableCatalogEntry>();
		auto &column_entry = table_entry.GetColumn(LogicalIndex(column_index));
		(void)table_entry;
		(void)column_entry;
		D_ASSERT(column_entry.Category() == TableColumnType::STANDARD);
	}
	// fetch the type of the column
	LogicalType col_type;
	auto ventry = virtual_columns.find(column_index);
	if (ventry != virtual_columns.end()) {
		// virtual column - fetch type from there
		col_type = ventry->second.type;
	} else {
		// normal column: fetch type from base column
		col_type = types[column_index];
		if (colref.GetAlias().empty()) {
			colref.SetAlias(names[column_index]);
		}
	}
	ColumnBinding binding = GetColumnBinding(column_index);
	return BindResult(make_uniq<BoundColumnRefExpression>(colref.GetName(), col_type, binding, depth));
}